

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleUVRowDownEvenBox_C
               (uint8_t *src_uv,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_uv,int dst_width)

{
  byte *pbVar1;
  long lVar2;
  
  if (0 < dst_width) {
    pbVar1 = src_uv + 3;
    lVar2 = 0;
    do {
      dst_uv[lVar2 * 2] =
           (uint8_t)((uint)pbVar1[src_stride + -3] + (uint)pbVar1[-1] + (uint)pbVar1[-3] +
                     (uint)pbVar1[src_stride + -1] + 2 >> 2);
      dst_uv[lVar2 * 2 + 1] =
           (uint8_t)((uint)pbVar1[src_stride + -2] + (uint)*pbVar1 + (uint)pbVar1[-2] +
                     (uint)pbVar1[src_stride] + 2 >> 2);
      lVar2 = lVar2 + 1;
      pbVar1 = pbVar1 + src_stepx * 2;
    } while (dst_width != (int)lVar2);
  }
  return;
}

Assistant:

void ScaleUVRowDownEvenBox_C(const uint8_t* src_uv,
                             ptrdiff_t src_stride,
                             int src_stepx,
                             uint8_t* dst_uv,
                             int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_uv[0] = (src_uv[0] + src_uv[2] + src_uv[src_stride] +
                 src_uv[src_stride + 2] + 2) >>
                2;
    dst_uv[1] = (src_uv[1] + src_uv[3] + src_uv[src_stride + 1] +
                 src_uv[src_stride + 3] + 2) >>
                2;
    src_uv += src_stepx * 2;
    dst_uv += 2;
  }
}